

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O0

void __thiscall QSplitterHandle::moveSplitter(QSplitterHandle *this,int pos)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QSplitterHandlePrivate *widget;
  int in_ESI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QSplitterHandlePrivate *d;
  int in_stack_00000068;
  int in_stack_0000006c;
  QSplitter *in_stack_00000070;
  QRect *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  widget = d_func((QSplitterHandle *)0x69845e);
  bVar2 = QWidget::isRightToLeft((QWidget *)0x698474);
  if ((bVar2) && (widget->orient == Horizontal)) {
    QWidget::contentsRect(in_RDI);
    iVar3 = QRect::width(in_stack_ffffffffffffffb8);
    in_ESI = iVar3 - in_ESI;
  }
  QSplitter::indexOf((QSplitter *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8),(QWidget *)widget);
  QSplitter::moveSplitter(in_stack_00000070,in_stack_0000006c,in_stack_00000068);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSplitterHandle::moveSplitter(int pos)
{
    Q_D(QSplitterHandle);
    if (d->s->isRightToLeft() && d->orient == Qt::Horizontal)
        pos = d->s->contentsRect().width() - pos;
    d->s->moveSplitter(pos, d->s->indexOf(this));
}